

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O2

bool __thiscall cmSourceFile::FindFullPath(cmSourceFile *this,string *error)

{
  char **ppcVar1;
  string *psVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  bool bVar5;
  char *pcVar6;
  cmake *pcVar7;
  cmake *pcVar8;
  ostream *poVar9;
  pointer pbVar10;
  string *ext;
  char **local_240;
  string missing;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hdrExts;
  char *tryDirs [3];
  string local_1c8;
  ostringstream e;
  size_type local_1a0;
  
  if (this->FindFullPathFailed == false) {
    std::__cxx11::string::string((string *)&e,"GENERATED",(allocator *)&missing);
    bVar4 = GetPropertyAsBool(this,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    if (bVar4) {
      cmSourceFileLocation::DirectoryUseBinary(&this->Location);
      psVar2 = &this->FullPath;
      std::__cxx11::string::_M_assign((string *)psVar2);
      std::__cxx11::string::append((char *)psVar2);
      std::__cxx11::string::append((string *)psVar2);
      bVar4 = true;
    }
    else {
      pcVar3 = (this->Location).Makefile;
      tryDirs[2] = (char *)0x0;
      tryDirs[0] = (char *)0x0;
      tryDirs[1] = (char *)0x0;
      if ((this->Location).AmbiguousDirectory == true) {
        pcVar6 = cmMakefile::GetCurrentSourceDirectory(pcVar3);
        tryDirs[0] = pcVar6;
        tryDirs[1] = cmMakefile::GetCurrentBinaryDirectory(pcVar3);
      }
      else {
        pcVar6 = "";
        tryDirs[0] = "";
      }
      pcVar7 = cmMakefile::GetCMakeInstance(pcVar3);
      pcVar8 = cmMakefile::GetCMakeInstance(pcVar3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&hdrExts,&pcVar8->HeaderFileExtensions);
      psVar2 = &(this->Location).Directory;
      local_240 = tryDirs;
      while (bVar4 = pcVar6 != (char *)0x0, bVar4) {
        std::__cxx11::string::string((string *)&e,(string *)psVar2);
        if (local_1a0 != 0) {
          std::__cxx11::string::append((char *)&e);
        }
        std::__cxx11::string::append((string *)&e);
        cmsys::SystemTools::CollapseFullPath(&missing,(string *)&e,*local_240);
        std::__cxx11::string::operator=((string *)&e,(string *)&missing);
        std::__cxx11::string::~string((string *)&missing);
        std::__cxx11::string::string((string *)&missing,"",(allocator *)&local_1c8);
        bVar5 = TryFullPath(this,(string *)&e,&missing);
        std::__cxx11::string::~string((string *)&missing);
        if (bVar5) {
LAB_00308733:
          std::__cxx11::string::~string((string *)&e);
          goto LAB_00308740;
        }
        pbVar10 = (pcVar7->SourceFileExtensions).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        while (ext = hdrExts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
              pbVar10 !=
              (pcVar7->SourceFileExtensions).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
          bVar5 = TryFullPath(this,(string *)&e,pbVar10);
          pbVar10 = pbVar10 + 1;
          if (bVar5) goto LAB_00308733;
        }
        while (ext != hdrExts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          bVar5 = TryFullPath(this,(string *)&e,ext);
          ext = ext + 1;
          if (bVar5) goto LAB_00308733;
        }
        std::__cxx11::string::~string((string *)&e);
        ppcVar1 = local_240 + 1;
        local_240 = local_240 + 1;
        pcVar6 = *ppcVar1;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::__cxx11::string::string((string *)&missing,(string *)psVar2);
      if (missing._M_string_length != 0) {
        std::__cxx11::string::append((char *)&missing);
      }
      std::__cxx11::string::append((string *)&missing);
      poVar9 = std::operator<<((ostream *)&e,"Cannot find source file:\n  ");
      poVar9 = std::operator<<(poVar9,(string *)&missing);
      std::operator<<(poVar9,"\nTried extensions");
      for (pbVar10 = (pcVar7->SourceFileExtensions).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar10 !=
          (pcVar7->SourceFileExtensions).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar10 = pbVar10 + 1) {
        poVar9 = std::operator<<((ostream *)&e," .");
        std::operator<<(poVar9,(string *)pbVar10);
      }
      for (pbVar10 = hdrExts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar10 !=
          hdrExts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar10 = pbVar10 + 1) {
        poVar9 = std::operator<<((ostream *)&e," .");
        std::operator<<(poVar9,(string *)pbVar10);
      }
      if (error == (string *)0x0) {
        pcVar3 = (this->Location).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&local_1c8,false);
      }
      else {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)error,(string *)&local_1c8);
      }
      std::__cxx11::string::~string((string *)&local_1c8);
      this->FindFullPathFailed = true;
      std::__cxx11::string::~string((string *)&missing);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
LAB_00308740:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&hdrExts);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool cmSourceFile::FindFullPath(std::string* error)
{
  // If thie method has already failed once do not try again.
  if(this->FindFullPathFailed)
    {
    return false;
    }

  // If the file is generated compute the location without checking on
  // disk.
  if(this->GetPropertyAsBool("GENERATED"))
    {
    // The file is either already a full path or is relative to the
    // build directory for the target.
    this->Location.DirectoryUseBinary();
    this->FullPath = this->Location.GetDirectory();
    this->FullPath += "/";
    this->FullPath += this->Location.GetName();
    return true;
    }

  // The file is not generated.  It must exist on disk.
  cmMakefile const* mf = this->Location.GetMakefile();
  const char* tryDirs[3] = {0, 0, 0};
  if(this->Location.DirectoryIsAmbiguous())
    {
    tryDirs[0] = mf->GetCurrentSourceDirectory();
    tryDirs[1] = mf->GetCurrentBinaryDirectory();
    }
  else
    {
    tryDirs[0] = "";
    }
  const std::vector<std::string>& srcExts =
      mf->GetCMakeInstance()->GetSourceExtensions();
  std::vector<std::string> hdrExts =
      mf->GetCMakeInstance()->GetHeaderExtensions();
  for(const char* const* di = tryDirs; *di; ++di)
    {
    std::string tryPath = this->Location.GetDirectory();
    if(!tryPath.empty())
      {
      tryPath += "/";
      }
    tryPath += this->Location.GetName();
    tryPath = cmSystemTools::CollapseFullPath(tryPath, *di);
    if(this->TryFullPath(tryPath, ""))
      {
      return true;
      }
    for(std::vector<std::string>::const_iterator ei = srcExts.begin();
        ei != srcExts.end(); ++ei)
      {
      if(this->TryFullPath(tryPath, *ei))
        {
        return true;
        }
      }
    for(std::vector<std::string>::const_iterator ei = hdrExts.begin();
        ei != hdrExts.end(); ++ei)
      {
      if(this->TryFullPath(tryPath, *ei))
        {
        return true;
        }
      }
    }

  std::ostringstream e;
  std::string missing = this->Location.GetDirectory();
  if(!missing.empty())
    {
    missing += "/";
    }
  missing += this->Location.GetName();
  e << "Cannot find source file:\n  " << missing << "\nTried extensions";
  for(std::vector<std::string>::const_iterator ext = srcExts.begin();
      ext != srcExts.end(); ++ext)
    {
    e << " ." << *ext;
    }
  for(std::vector<std::string>::const_iterator ext = hdrExts.begin();
      ext != hdrExts.end(); ++ext)
    {
    e << " ." << *ext;
    }
  if(error)
    {
    *error = e.str();
    }
  else
    {
    this->Location.GetMakefile()->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
  this->FindFullPathFailed = true;
  return false;
}